

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

void Gia_ManSpecBuildInit
               (Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vXorLits,int f,int fDualOut)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Gia_Obj_t *pObj_00;
  int iLitNew;
  Gia_Obj_t *pRepr;
  int fDualOut_local;
  int f_local;
  Vec_Int_t *vXorLits_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  Gia_Man_t *pNew_local;
  
  iVar1 = Gia_ObjId(p,pObj);
  pObj_00 = Gia_ObjReprObj(p,iVar1);
  if (pObj_00 != (Gia_Obj_t *)0x0) {
    if (fDualOut != 0) {
      iVar1 = Gia_ObjId(p,pObj);
      iVar2 = Gia_ObjId(p,pObj_00);
      iVar1 = Gia_ObjDiffColors2(p,iVar1,iVar2);
      if (iVar1 == 0) {
        return;
      }
    }
    iVar1 = Gia_ObjCopyF(p,f,pObj_00);
    uVar3 = Gia_ObjPhaseReal(pObj_00);
    uVar4 = Gia_ObjPhaseReal(pObj);
    iVar1 = Abc_LitNotCond(iVar1,uVar3 ^ uVar4);
    iVar2 = Gia_ObjCopyF(p,f,pObj);
    if (iVar2 != iVar1) {
      iVar2 = Gia_ObjId(p,pObj);
      iVar2 = Gia_ObjProved(p,iVar2);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjCopyF(p,f,pObj);
        iVar2 = Gia_ManHashXor(pNew,iVar2,iVar1);
        Vec_IntPush(vXorLits,iVar2);
      }
    }
    Gia_ObjSetCopyF(p,f,pObj,iVar1);
  }
  return;
}

Assistant:

void Gia_ManSpecBuildInit( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vXorLits, int f, int fDualOut )
{
    Gia_Obj_t * pRepr;
    int iLitNew;
    pRepr = Gia_ObjReprObj( p, Gia_ObjId(p,pObj) );
    if ( pRepr == NULL )
        return;
//    if ( fDualOut && !Gia_ObjDiffColors( p, Gia_ObjId(p, pObj), Gia_ObjId(p, pRepr) ) )
    if ( fDualOut && !Gia_ObjDiffColors2( p, Gia_ObjId(p, pObj), Gia_ObjId(p, pRepr) ) )
        return;
    iLitNew = Abc_LitNotCond( Gia_ObjCopyF(p, f, pRepr), Gia_ObjPhaseReal(pRepr) ^ Gia_ObjPhaseReal(pObj) );
    if ( Gia_ObjCopyF(p, f, pObj) != iLitNew && !Gia_ObjProved(p, Gia_ObjId(p,pObj)) )
        Vec_IntPush( vXorLits, Gia_ManHashXor(pNew, Gia_ObjCopyF(p, f, pObj), iLitNew) );
    Gia_ObjSetCopyF( p, f, pObj, iLitNew );
}